

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Coefficients::Coefficients(Coefficients *this,Coefficients *from)

{
  Coefficients *from_local;
  Coefficients *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Coefficients_006fa4a8;
  google::protobuf::RepeatedField<double>::RepeatedField(&this->alpha_,&from->alpha_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

Coefficients::Coefficients(const Coefficients& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      alpha_(from.alpha_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Coefficients)
}